

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

void append_hex_to_strbuf(strbuf *sb,mp_int *x)

{
  char *__s;
  size_t len;
  size_t hexlen;
  char *hex;
  mp_int *x_local;
  strbuf *sb_local;
  
  if (sb->len != 0) {
    BinarySink_put_byte(sb->binarysink_,',');
  }
  BinarySink_put_data(sb->binarysink_,"0x",2);
  __s = mp_get_hex(x);
  len = strlen(__s);
  BinarySink_put_data(sb->binarysink_,__s,len);
  smemclr(__s,len);
  safefree(__s);
  return;
}

Assistant:

static void append_hex_to_strbuf(strbuf *sb, mp_int *x)
{
    if (sb->len > 0)
        put_byte(sb, ',');
    put_data(sb, "0x", 2);
    char *hex = mp_get_hex(x);
    size_t hexlen = strlen(hex);
    put_data(sb, hex, hexlen);
    smemclr(hex, hexlen);
    sfree(hex);
}